

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::restoredashinput(Forth *this)

{
  bool bVar1;
  uint uVar2;
  reference save_00;
  structSavedInput *save;
  iterator __end2;
  iterator __begin2;
  vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
  *__range2;
  Cell saveId;
  Cell n;
  Forth *this_local;
  
  requireDStackDepth(this,1,"RESTORE-INPUT");
  ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  requireDStackDepth(this,1,"RESTORE-INPUT");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  __end2 = std::
           vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
           ::begin(&this->savedInputVector);
  save = (structSavedInput *)
         std::
         vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
         ::end(&this->savedInputVector);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<cppforth::Forth::structSavedInput_*,_std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>_>
                      (&__end2,(__normal_iterator<cppforth::Forth::structSavedInput_*,_std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>_>
                                *)&save);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ForthStack<unsigned_int>::setTop(&this->dStack,this->True);
      return;
    }
    save_00 = __gnu_cxx::
              __normal_iterator<cppforth::Forth::structSavedInput_*,_std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>_>
              ::operator*(&__end2);
    if (save_00->saveId == uVar2) break;
    __gnu_cxx::
    __normal_iterator<cppforth::Forth::structSavedInput_*,_std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>_>
    ::operator++(&__end2);
  }
  restoreInput(this,save_00,false,false);
  ForthStack<unsigned_int>::setTop(&this->dStack,this->False);
  return;
}

Assistant:

void restoredashinput() {
#ifdef _DEBUG
			auto depth = dStack.stackDepth();
#endif
			REQUIRE_DSTACK_DEPTH(1, "RESTORE-INPUT");
			Cell n = dStack.getTop(); dStack.pop();
			REQUIRE_DSTACK_DEPTH(1, "RESTORE-INPUT");
			Cell saveId= dStack.getTop(); ;
			for (auto& save : savedInputVector) {
				if (save.saveId == saveId) {
					restoreInput(save, false,false);
					dStack.setTop(False); // can be restored
					// @bug delete this save from vector
					return;
				}
			}
			dStack.setTop(True); // cannot be restored
		}